

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * declaration_specifiers(dmr_C *C,token *token,decl_state *ctx)

{
  uint *puVar1;
  keyword kVar2;
  symbol_op *psVar3;
  position pos;
  bool bVar4;
  symbol *psVar5;
  char *pcVar6;
  uint what;
  int iVar7;
  uint uVar8;
  int iVar9;
  int local_3c;
  
  uVar8 = 0;
  local_3c = 0;
  iVar9 = 0;
  do {
    if (((ulong)token->pos & 0x3f) != 2) break;
    psVar5 = dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    bVar4 = true;
    if ((psVar5 != (symbol *)0x0) && ((*(uint *)psVar5 >> 9 & 1) != 0)) {
      if ((char)*(uint *)psVar5 == '\x11') {
        psVar3 = psVar5->op;
        kVar2 = psVar3->type;
        if ((kVar2 & KW_SPECIFIER) != 0) {
          what = psVar3->test & uVar8;
          if (what != 0) {
            specifier_conflict(C,token->pos,what,(token->field_2).ident);
            goto LAB_001185a4;
          }
          uVar8 = uVar8 | psVar3->set;
          local_3c = local_3c + psVar3->cls;
          iVar7 = iVar9;
          if (((uint)psVar3->set >> 0xb & 1) != 0) {
            iVar7 = 2;
          }
          iVar9 = -1;
          if (((-1 < (char)kVar2) && (iVar9 = iVar7, (kVar2 >> 8 & 1) != 0)) &&
             (iVar9 = iVar7 + 1, iVar7 != 0)) {
            if (local_3c == 3) {
              pos = token->pos;
              pcVar6 = dmrC_show_ident(C,C->S->double_ident);
              dmrC_sparse_error(C,pos,"impossible combination of type specifiers: %s %s","long long"
                                ,pcVar6);
              local_3c = 3;
              goto LAB_001185a4;
            }
            uVar8 = uVar8 | 0x400;
          }
        }
        token = token->next;
        if (psVar3->declarator != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
          token = (*psVar3->declarator)(C,token,ctx);
        }
        if ((psVar5->op->type & KW_EXACT) == 0) {
          bVar4 = false;
        }
        else {
          (ctx->ctype).base_type = (psVar5->field_14).field_2.ctype.base_type;
          (ctx->ctype).modifiers =
               (ctx->ctype).modifiers | (psVar5->field_14).field_2.ctype.modifiers;
          bVar4 = false;
        }
      }
      else if ((uVar8 & 0x3c1) == 0) {
        uVar8 = uVar8 | 3;
        (ctx->ctype).base_type = (psVar5->field_14).field_2.ctype.base_type;
        apply_ctype(C,token->pos,&(psVar5->field_14).field_2.ctype,&ctx->ctype);
        token = token->next;
        bVar4 = false;
      }
    }
LAB_001185a4:
  } while (!bVar4);
  if ((uVar8 & 2) == 0) {
    if ((uVar8 & 0x3c1) == 0) {
      psVar5 = &C->S->incomplete_ctype;
    }
    else {
      psVar5 = C->P->types[local_3c][iVar9];
    }
    (ctx->ctype).base_type = psVar5;
  }
  uVar8 = (uint)(ctx->ctype).modifiers;
  if ((int)uVar8 < 0) {
    (ctx->ctype).modifiers = (ulong)(uVar8 & 0x7fffffff);
    psVar5 = (ctx->ctype).base_type;
    if (*(char *)psVar5 == '\x03') {
      psVar5 = *(symbol **)((long)&psVar5->field_14 + 0x38);
    }
    if (*(char *)psVar5 == '\t') {
      psVar5 = (psVar5->field_14).field_2.ctype.base_type;
    }
    if ((*(char *)psVar5 == '\r') || ((psVar5->field_14).field_2.ctype.base_type == &C->S->int_type)
       ) {
      psVar5 = dmrC_alloc_symbol(C->S,token->pos,2);
      memcpy(psVar5,(ctx->ctype).base_type,0xe8);
      puVar1 = (uint *)((long)&psVar5->field_14 + 0x18);
      *puVar1 = *puVar1 & 0xbfffe03f;
      (psVar5->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
      *(undefined1 *)psVar5 = 0xf;
      (ctx->ctype).base_type = psVar5;
      dmrC_create_fouled(C->S,psVar5);
    }
    else {
      dmrC_sparse_error(C,token->pos,"invalid modifier");
    }
  }
  return token;
}

Assistant:

static struct token *declaration_specifiers(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	int seen = 0;
	int cls = CInt;
	int size = 0;

	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct symbol *s = dmrC_lookup_symbol(token->ident,
						 NS_TYPEDEF | NS_SYMBOL);
		if (!s || !(s->ns & NS_TYPEDEF))
			break;
		if (s->type != SYM_KEYWORD) {
			if (seen & Set_Any)
				break;
			seen |= Set_S | Set_T;
			ctx->ctype.base_type = s->ctype.base_type;
			apply_ctype(C, token->pos, &s->ctype, &ctx->ctype);
			token = token->next;
			continue;
		}
		if (s->op->type & KW_SPECIFIER) {
			if (seen & s->op->test) {
				specifier_conflict(C, token->pos,
						   seen & s->op->test,
						   token->ident);
				break;
			}
			seen |= s->op->set;
			cls += s->op->cls;
			if (s->op->set & Set_Int128)
				size = 2;
			if (s->op->type & KW_SHORT) {
				size = -1;
			} else if (s->op->type & KW_LONG && size++) {
				if (cls == CReal) {
					specifier_conflict(C, token->pos,
							   Set_Vlong,
							   C->S->double_ident);
					break;
				}
				seen |= Set_Vlong;
			}
		}
		token = token->next;
		if (s->op->declarator)
			token = s->op->declarator(C, token, ctx);
		if (s->op->type & KW_EXACT) {
			ctx->ctype.base_type = s->ctype.base_type;
			ctx->ctype.modifiers |= s->ctype.modifiers;
		}
	}

	if (!(seen & Set_S)) {	/* not set explicitly? */
		struct symbol *base = &C->S->incomplete_ctype;
		if (seen & Set_Any)
			base = C->P->types[cls][size];
		ctx->ctype.base_type = base;
	}

	if (ctx->ctype.modifiers & MOD_BITWISE) {
		struct symbol *type;
		ctx->ctype.modifiers &= ~MOD_BITWISE;
		if (!dmrC_is_int_type(C->S, ctx->ctype.base_type)) {
			dmrC_sparse_error(C, token->pos, "invalid modifier");
			return token;
		}
		type = dmrC_alloc_symbol(C->S, token->pos, SYM_BASETYPE);
		*type = *ctx->ctype.base_type;
		type->ctype.modifiers &= ~MOD_SPECIFIER;
		type->ctype.base_type = ctx->ctype.base_type;
		type->type = SYM_RESTRICT;
		ctx->ctype.base_type = type;
		dmrC_create_fouled(C->S, type);
	}
	return token;
}